

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffparse.c
# Opt level: O1

FT_Error cff_parse_blend(CFF_Parser parser)

{
  FT_UInt vsindex;
  FT_UInt lenNDV;
  void *pvVar1;
  long lVar2;
  FT_Fixed *NDV;
  FT_Byte *block;
  FT_Byte *pFVar3;
  FT_Byte *pFVar4;
  long lVar5;
  undefined1 *puVar6;
  FT_Bool FVar7;
  FT_Error FVar8;
  uint uVar9;
  uint uVar10;
  FT_PtrDist offset;
  ulong uVar11;
  FT_Pointer pvVar12;
  FT_Long FVar13;
  int iVar14;
  FT_Byte **ppFVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  FT_Error local_34 [2];
  FT_Error error;
  
  pvVar1 = parser->object;
  if (pvVar1 == (void *)0x0) {
    return 3;
  }
  lVar2 = *(long *)((long)pvVar1 + 0x2d0);
  if (lVar2 == 0) {
    return 3;
  }
  vsindex = *(FT_UInt *)((long)pvVar1 + 0x2c8);
  lenNDV = *(FT_UInt *)(lVar2 + 0x450);
  NDV = *(FT_Fixed **)(lVar2 + 0x458);
  FVar7 = cff_blend_check_vector((CFF_Blend)(lVar2 + 0x420),vsindex,lenNDV,NDV);
  if ((FVar7 != '\0') &&
     (FVar8 = cff_blend_build_vector((CFF_Blend)(lVar2 + 0x420),vsindex,lenNDV,NDV), FVar8 != 0)) {
    return FVar8;
  }
  uVar11 = cff_parse_num(parser,parser->top + -1);
  uVar19 = (uint)uVar11;
  if (parser->stackSize < uVar19) {
    return 3;
  }
  local_34[0] = 0;
  uVar9 = *(int *)(lVar2 + 0x440) * uVar19;
  uVar10 = (uint)((ulong)((long)parser->top + (-8 - (long)parser->stack)) >> 3);
  iVar14 = uVar10 - uVar9;
  if (uVar10 < uVar9) {
    local_34[0] = 0xa1;
  }
  else {
    iVar17 = uVar19 * 5;
    uVar9 = *(uint *)(lVar2 + 0x474);
    if (uVar9 < (uint)(*(int *)(lVar2 + 0x470) + iVar17)) {
      block = *(FT_Byte **)(lVar2 + 0x460);
      pFVar3 = *(FT_Byte **)(lVar2 + 0x468);
      pvVar12 = ft_mem_realloc(*(FT_Memory *)(*(long *)(lVar2 + 0x428) + 0x10),1,(ulong)uVar9,
                               (ulong)(uVar9 + iVar17),block,local_34);
      *(FT_Pointer *)(lVar2 + 0x460) = pvVar12;
      if (local_34[0] != 0) goto LAB_001fe5cc;
      *(ulong *)(lVar2 + 0x468) = (ulong)*(uint *)(lVar2 + 0x470) + (long)pvVar12;
      *(int *)(lVar2 + 0x474) = *(int *)(lVar2 + 0x474) + iVar17;
      if ((block != (FT_Byte *)0x0) && ((long)pvVar12 - (long)block != 0)) {
        for (ppFVar15 = parser->stack; ppFVar15 < parser->top; ppFVar15 = ppFVar15 + 1) {
          pFVar4 = *ppFVar15;
          if ((block <= pFVar4) && (pFVar4 < pFVar3)) {
            *ppFVar15 = pFVar4 + ((long)pvVar12 - (long)block);
          }
        }
      }
    }
    *(int *)(lVar2 + 0x470) = *(int *)(lVar2 + 0x470) + iVar17;
    uVar9 = iVar14 + uVar19;
    if (uVar19 != 0) {
      uVar16 = 0;
      uVar19 = uVar9;
      do {
        lVar5 = *(long *)(lVar2 + 0x448);
        uVar10 = iVar14 + (int)uVar16;
        FVar13 = cff_parse_num(parser,parser->stack + uVar10);
        iVar17 = (int)FVar13 << 0x10;
        if (1 < *(uint *)(lVar2 + 0x440)) {
          lVar20 = 1;
          do {
            uVar18 = (ulong)uVar19;
            uVar19 = uVar19 + 1;
            FVar13 = cff_parse_num(parser,parser->stack + uVar18);
            iVar17 = iVar17 + (int)FVar13 * *(int *)(lVar5 + lVar20 * 4);
            lVar20 = lVar20 + 1;
          } while ((uint)lVar20 < *(uint *)(lVar2 + 0x440));
        }
        parser->stack[uVar10] = *(FT_Byte **)(lVar2 + 0x468);
        puVar6 = *(undefined1 **)(lVar2 + 0x468);
        *(undefined1 **)(lVar2 + 0x468) = puVar6 + 1;
        *puVar6 = 0xff;
        puVar6 = *(undefined1 **)(lVar2 + 0x468);
        *(undefined1 **)(lVar2 + 0x468) = puVar6 + 1;
        *puVar6 = (char)((uint)iVar17 >> 0x18);
        puVar6 = *(undefined1 **)(lVar2 + 0x468);
        *(undefined1 **)(lVar2 + 0x468) = puVar6 + 1;
        *puVar6 = (char)((uint)iVar17 >> 0x10);
        puVar6 = *(undefined1 **)(lVar2 + 0x468);
        *(undefined1 **)(lVar2 + 0x468) = puVar6 + 1;
        *puVar6 = (char)((uint)iVar17 >> 8);
        puVar6 = *(undefined1 **)(lVar2 + 0x468);
        *(undefined1 **)(lVar2 + 0x468) = puVar6 + 1;
        *puVar6 = (char)iVar17;
        uVar16 = uVar16 + 1;
      } while (uVar16 != (uVar11 & 0xffffffff));
    }
    parser->top = parser->stack + uVar9;
  }
LAB_001fe5cc:
  *(undefined1 *)(lVar2 + 0x421) = 1;
  return local_34[0];
}

Assistant:

static FT_Error
  cff_parse_blend( CFF_Parser  parser )
  {
    /* blend operator can only be used in a Private DICT */
    CFF_Private  priv = (CFF_Private)parser->object;
    CFF_SubFont  subFont;
    CFF_Blend    blend;
    FT_UInt      numBlends;
    FT_Error     error;


    if ( !priv || !priv->subfont )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    subFont = priv->subfont;
    blend   = &subFont->blend;

    if ( cff_blend_check_vector( blend,
                                 priv->vsindex,
                                 subFont->lenNDV,
                                 subFont->NDV ) )
    {
      error = cff_blend_build_vector( blend,
                                      priv->vsindex,
                                      subFont->lenNDV,
                                      subFont->NDV );
      if ( error )
        goto Exit;
    }

    numBlends = (FT_UInt)cff_parse_num( parser, parser->top - 1 );
    if ( numBlends > parser->stackSize )
    {
      FT_ERROR(( "cff_parse_blend: Invalid number of blends\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    FT_TRACE4(( "   %d value%s blended\n",
                numBlends,
                numBlends == 1 ? "" : "s" ));

    error = cff_blend_doBlend( subFont, parser, numBlends );

    blend->usedBV = TRUE;

  Exit:
    return error;
  }